

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_delete_failed_alert::torrent_delete_failed_alert
          (torrent_delete_failed_alert *this,stack_allocator *alloc,torrent_handle *h,error_code *e,
          sha1_hash *ih)

{
  error_category *peVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  undefined3 uVar6;
  string sStack_38;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_delete_failed_alert_00430f30;
  bVar5 = e->failed_;
  uVar6 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar5;
  *(undefined3 *)&(this->error).field_0x5 = uVar6;
  (this->error).cat_ = peVar1;
  uVar2 = (ih->m_number)._M_elems[1];
  uVar3 = (ih->m_number)._M_elems[2];
  uVar4 = (ih->m_number)._M_elems[3];
  (this->info_hash).m_number._M_elems[0] = (ih->m_number)._M_elems[0];
  (this->info_hash).m_number._M_elems[1] = uVar2;
  (this->info_hash).m_number._M_elems[2] = uVar3;
  (this->info_hash).m_number._M_elems[3] = uVar4;
  (this->info_hash).m_number._M_elems[4] = (ih->m_number)._M_elems[4];
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_38,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

torrent_delete_failed_alert::torrent_delete_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, error_code const& e, sha1_hash const& ih)
		: torrent_alert(alloc, h)
		, error(e)
		, info_hash(ih)
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(error.message()))
#endif
	{
	}